

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive *file,ON_wString *str)

{
  bool bVar1;
  uint in_EAX;
  char *p;
  int len;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ON_wString::Empty(str);
  uStack_28 = (ulong)(uint)uStack_28;
  bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)((long)&uStack_28 + 4));
  if (0 < (int)uStack_28._4_4_ && bVar1) {
    p = (char *)oncalloc(1,(ulong)uStack_28._4_4_ + 1);
    bVar1 = ON_BinaryArchive::ReadString(file,(long)(int)uStack_28._4_4_,p);
    if (bVar1) {
      ON_wString::operator=(str,p);
    }
    if (p != (char *)0x0) {
      onfree(p);
    }
  }
  return bVar1;
}

Assistant:

static bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive& file, ON_wString& str )
{
  // reads legacy 1.0 named view TCODE_NAME chunk
  str.Empty();
  int len = 0;
  bool rc = file.ReadInt( &len );
  if (rc && len > 0) {
    char* name = (char*)oncalloc( 1, len + 1);
    rc = file.ReadString( len, name );
    if (rc)
      str = name; // ASCII -> UNICODE
    if (name)
      onfree(name);
  }
  return rc;
}